

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::ChompIndicator(void)

{
  int iVar1;
  RegEx *unaff_retaddr;
  allocator local_21;
  string local_20 [20];
  REGEX_OP in_stack_fffffffffffffff4;
  string *in_stack_fffffffffffffff8;
  
  if (ChompIndicator()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ChompIndicator()::e);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20,"+-",&local_21);
      RegEx::RegEx(unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
      std::__cxx11::string::~string(local_20);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(RegEx::~RegEx,&ChompIndicator::e,&__dso_handle);
      __cxa_guard_release(&ChompIndicator()::e);
    }
  }
  return &ChompIndicator::e;
}

Assistant:

inline const RegEx& ChompIndicator() {
  static const RegEx e = RegEx("+-", REGEX_OR);
  return e;
}